

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visit
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Expression *curr)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  pair<wasm::Module_&,_wasm::Expression_*> local_80;
  pair<wasm::Module_&,_wasm::Type> local_70;
  pair<wasm::Module_&,_wasm::Type> local_60;
  uintptr_t local_50;
  uintptr_t local_48;
  Type local_40;
  Type type;
  Expression *local_20;
  Expression *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Flow *ret;
  
  this->depth = this->depth + 1;
  local_20 = curr;
  curr_local = (Expression *)this;
  this_local = (ExpressionRunner<wasm::ModuleRunner> *)__return_storage_ptr__;
  if ((this->maxDepth != 0) && (this->maxDepth < this->depth)) {
    (*this->_vptr_ExpressionRunner[3])(this,"interpreter recursion limit");
  }
  Visitor<wasm::ModuleRunner,_wasm::Flow>::visit
            (__return_storage_ptr__,(Visitor<wasm::ModuleRunner,_wasm::Flow> *)this,local_20);
  bVar1 = Flow::breaking(__return_storage_ptr__);
  if (!bVar1) {
    local_40 = Flow::getType(__return_storage_ptr__);
    bVar1 = Type::isConcrete(&local_40);
    if ((bVar1) || (bVar1 = Type::isConcrete(&local_20->type), bVar1)) {
      local_48 = local_40.id;
      local_50 = (local_20->type).id;
      bVar2 = ::wasm::Type::isSubType(local_40,(Type)local_50);
      if ((bVar2 & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"expected ");
        std::pair<wasm::Module_&,_wasm::Type>::pair<wasm::Type_&,_true>
                  (&local_60,this->module,&local_20->type);
        poVar3 = (ostream *)std::operator<<(poVar3,local_60.first,local_60.second.id);
        poVar3 = std::operator<<(poVar3,", seeing ");
        std::pair<wasm::Module_&,_wasm::Type>::pair<wasm::Type_&,_true>
                  (&local_70,this->module,&local_40);
        poVar3 = (ostream *)std::operator<<(poVar3,local_70.first,local_70.second.id);
        poVar3 = std::operator<<(poVar3," from\n");
        std::pair<wasm::Module_&,_wasm::Expression_*>::pair<wasm::Expression_*&,_true>
                  (&local_80,this->module,&local_20);
        poVar3 = (ostream *)std::operator<<(poVar3,local_80.first,local_80.second);
        std::operator<<(poVar3,'\n');
      }
      bVar2 = ::wasm::Type::isSubType(local_40,(Type)(local_20->type).id);
      if ((bVar2 & 1) == 0) {
        __assert_fail("Type::isSubType(type, curr->type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x10b,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visit(Expression *) [SubType = wasm::ModuleRunner]"
                     );
      }
    }
  }
  this->depth = this->depth - 1;
  return __return_storage_ptr__;
}

Assistant:

Flow visit(Expression* curr) {
    depth++;
    if (maxDepth != NO_LIMIT && depth > maxDepth) {
      hostLimit("interpreter recursion limit");
    }
    auto ret = OverriddenVisitor<SubType, Flow>::visit(curr);
    if (!ret.breaking()) {
      Type type = ret.getType();
      if (type.isConcrete() || curr->type.isConcrete()) {
#if 1 // def WASM_INTERPRETER_DEBUG
        if (!Type::isSubType(type, curr->type)) {
          std::cerr << "expected " << ModuleType(*module, curr->type)
                    << ", seeing " << ModuleType(*module, type) << " from\n"
                    << ModuleExpression(*module, curr) << '\n';
        }
#endif
        assert(Type::isSubType(type, curr->type));
      }
    }
    depth--;
    return ret;
  }